

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

int32_t __thiscall
icu_63::DateTimeMatcher::getDistance
          (DateTimeMatcher *this,DateTimeMatcher *other,int32_t includeMask,
          DistanceInfo *distanceInfo)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  distanceInfo->missingFieldMask = 0;
  distanceInfo->extraFieldMask = 0;
  lVar3 = 0;
  iVar2 = 0;
  uVar6 = 0;
  uVar7 = 0;
  do {
    uVar8 = 1 << ((byte)lVar3 & 0x1f);
    iVar5 = 0;
    if (((uint)includeMask >> ((uint)lVar3 & 0x1f) & 1) != 0) {
      iVar5 = (this->skeleton).type[lVar3];
    }
    iVar1 = (other->skeleton).type[lVar3];
    iVar4 = iVar5 - iVar1;
    if (iVar4 != 0) {
      if (iVar5 == 0) {
        iVar2 = iVar2 + 0x10000;
        uVar7 = uVar7 | uVar8;
        distanceInfo->extraFieldMask = uVar7;
      }
      else if (iVar1 == 0) {
        iVar2 = iVar2 + 0x1000;
        uVar6 = uVar6 | uVar8;
        distanceInfo->missingFieldMask = uVar6;
      }
      else {
        iVar5 = -iVar4;
        if (0 < iVar4) {
          iVar5 = iVar4;
        }
        iVar2 = iVar2 + iVar5;
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return iVar2;
}

Assistant:

int32_t
DateTimeMatcher::getDistance(const DateTimeMatcher& other, int32_t includeMask, DistanceInfo& distanceInfo) const {
    int32_t result = 0;
    distanceInfo.clear();
    for (int32_t i=0; i<UDATPG_FIELD_COUNT; ++i ) {
        int32_t myType = (includeMask&(1<<i))==0 ? 0 : skeleton.type[i];
        int32_t otherType = other.skeleton.type[i];
        if (myType==otherType) {
            continue;
        }
        if (myType==0) {// and other is not
            result += EXTRA_FIELD;
            distanceInfo.addExtra(i);
        }
        else {
            if (otherType==0) {
                result += MISSING_FIELD;
                distanceInfo.addMissing(i);
            }
            else {
                result += abs(myType - otherType);
            }
        }

    }
    return result;
}